

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::InterpretArgument
          (CommandLineInterface *this,string *name,string *value)

{
  string *__return_storage_ptr__;
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  char *pcVar7;
  LogMessage *other;
  iterator __first;
  iterator __last;
  mapped_type *pmVar8;
  ostream *poVar9;
  Mode MVar10;
  int version;
  bool local_46a;
  byte local_43a;
  byte local_439;
  string local_3c0 [32];
  string local_3a0 [32];
  long local_380;
  size_type colon_pos;
  OutputDirective directive;
  string *parameters_1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  mapped_type *local_298;
  string *parameters;
  string local_288;
  second_type *local_268;
  GeneratorInfo *generator_info;
  string local_240 [32];
  string local_220 [32];
  long local_200;
  size_type slash_pos;
  size_type equals_pos_1;
  string path;
  string plugin_name;
  LogFinisher local_17a;
  byte local_179;
  LogMessage local_178;
  undefined1 local_140 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  direct;
  string local_e0 [32];
  string local_c0 [48];
  long local_90;
  size_type equals_pos;
  string disk_path;
  string virtual_path;
  undefined1 local_40 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string *value_local;
  string *name_local;
  CommandLineInterface *this_local;
  
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = value;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar1 = std::operator==(name,"-I");
    if ((bVar1) || (bVar1 = std::operator==(name,"--proto_path"), bVar1)) {
      Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40,
            parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,(anonymous_namespace)::kPathSeparator
            ,true);
      for (virtual_path.field_2._12_4_ = 0;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_40), (ulong)(long)(int)virtual_path.field_2._12_4_ < sVar5;
          virtual_path.field_2._12_4_ = virtual_path.field_2._12_4_ + 1) {
        std::__cxx11::string::string((string *)(disk_path.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)&equals_pos);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,(long)(int)virtual_path.field_2._12_4_);
        local_90 = std::__cxx11::string::find_first_of((char)pvVar6,0x3d);
        if (local_90 == -1) {
          std::__cxx11::string::operator=((string *)(disk_path.field_2._M_local_buf + 8),"");
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_40,(long)(int)virtual_path.field_2._12_4_);
          std::__cxx11::string::operator=((string *)&equals_pos,(string *)pvVar6);
        }
        else {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_40,(long)(int)virtual_path.field_2._12_4_);
          std::__cxx11::string::substr((ulong)local_c0,(ulong)pvVar6);
          std::__cxx11::string::operator=((string *)(disk_path.field_2._M_local_buf + 8),local_c0);
          std::__cxx11::string::~string(local_c0);
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_40,(long)(int)virtual_path.field_2._12_4_);
          std::__cxx11::string::substr((ulong)local_e0,(ulong)pvVar6);
          std::__cxx11::string::operator=((string *)&equals_pos,local_e0);
          std::__cxx11::string::~string(local_e0);
        }
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          pcVar7 = (char *)std::__cxx11::string::c_str();
          iVar3 = access(pcVar7,0);
          if (iVar3 < 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_40,(long)(int)virtual_path.field_2._12_4_);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            iVar3 = access(pcVar7,0);
            if (iVar3 < 0) {
              poVar9 = std::operator<<((ostream *)&std::cerr,(string *)&equals_pos);
              poVar9 = std::operator<<(poVar9,": warning: directory does not exist.");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            }
            else {
              std::__cxx11::string::operator=((string *)(disk_path.field_2._M_local_buf + 8),"");
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_40,(long)(int)virtual_path.field_2._12_4_);
              std::__cxx11::string::operator=((string *)&equals_pos,(string *)pvVar6);
            }
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&direct.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&disk_path.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &equals_pos);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back(&this->proto_path_,
                      (value_type *)
                      &direct.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&direct.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar1 = false;
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "--proto_path passed empty directory name.  (Use \".\" for current directory.)"
                                  );
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          this_local._4_4_ = PARSE_ARGUMENT_FAIL;
          bVar1 = true;
        }
        std::__cxx11::string::~string((string *)&equals_pos);
        std::__cxx11::string::~string((string *)(disk_path.field_2._M_local_buf + 8));
        if (bVar1) goto LAB_0035cacb;
      }
      bVar1 = false;
LAB_0035cacb:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      if (bVar1) {
        return this_local._4_4_;
      }
    }
    else {
      bVar1 = std::operator==(name,"--direct_dependencies");
      if (bVar1) {
        if ((this->direct_dependencies_explicitly_set_ & 1U) != 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
          poVar9 = std::operator<<(poVar9,
                                   " may only be passed once. To specify multiple direct dependencies, pass them all as a single parameter separated by \':\'."
                                  );
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          return PARSE_ARGUMENT_FAIL;
        }
        this->direct_dependencies_explicitly_set_ = true;
        Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_140,
              parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,":",true);
        bVar1 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->direct_dependencies_);
        local_179 = 0;
        if (!bVar1) {
          internal::LogMessage::LogMessage
                    (&local_178,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x4e2);
          local_179 = 1;
          other = internal::LogMessage::operator<<
                            (&local_178,"CHECK failed: direct_dependencies_.empty(): ");
          internal::LogFinisher::operator=(&local_17a,other);
        }
        if ((local_179 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_178);
        }
        __first = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_140);
        __last = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_140);
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->direct_dependencies_,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__first._M_current,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__last._M_current);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_140);
      }
      else {
        bVar1 = std::operator==(name,"--direct_dependencies_violation_msg");
        if (bVar1) {
          std::__cxx11::string::operator=
                    ((string *)&this->direct_dependencies_violation_msg_,
                     (string *)
                     parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          bVar1 = std::operator==(name,"-o");
          if ((bVar1) || (bVar1 = std::operator==(name,"--descriptor_set_out"), bVar1)) {
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
              poVar9 = std::operator<<(poVar9," may only be passed once.");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              return PARSE_ARGUMENT_FAIL;
            }
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) != 0) {
              poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
              poVar9 = std::operator<<(poVar9," requires a non-empty value.");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              return PARSE_ARGUMENT_FAIL;
            }
            if (this->mode_ != MODE_COMPILE) {
              poVar9 = std::operator<<((ostream *)&std::cerr,
                                       "Cannot use --encode or --decode and generate descriptors at the same time."
                                      );
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              return PARSE_ARGUMENT_FAIL;
            }
            std::__cxx11::string::operator=
                      ((string *)&this->descriptor_set_name_,
                       (string *)
                       parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            bVar1 = std::operator==(name,"--dependency_out");
            if (bVar1) {
              uVar4 = std::__cxx11::string::empty();
              if ((uVar4 & 1) == 0) {
                poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
                poVar9 = std::operator<<(poVar9," may only be passed once.");
                std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                return PARSE_ARGUMENT_FAIL;
              }
              uVar4 = std::__cxx11::string::empty();
              if ((uVar4 & 1) != 0) {
                poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
                poVar9 = std::operator<<(poVar9," requires a non-empty value.");
                std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                return PARSE_ARGUMENT_FAIL;
              }
              std::__cxx11::string::operator=
                        ((string *)&this->dependency_out_name_,
                         (string *)
                         parts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              bVar1 = std::operator==(name,"--include_imports");
              if (bVar1) {
                if ((this->imports_in_descriptor_set_ & 1U) != 0) {
                  poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
                  poVar9 = std::operator<<(poVar9," may only be passed once.");
                  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                  return PARSE_ARGUMENT_FAIL;
                }
                this->imports_in_descriptor_set_ = true;
              }
              else {
                bVar1 = std::operator==(name,"--include_source_info");
                if (bVar1) {
                  if ((this->source_info_in_descriptor_set_ & 1U) != 0) {
                    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
                    poVar9 = std::operator<<(poVar9," may only be passed once.");
                    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                    return PARSE_ARGUMENT_FAIL;
                  }
                  this->source_info_in_descriptor_set_ = true;
                }
                else {
                  bVar1 = std::operator==(name,"-h");
                  if ((bVar1) || (bVar1 = std::operator==(name,"--help"), bVar1)) {
                    PrintHelpText(this);
                    return PARSE_ARGUMENT_DONE_AND_EXIT;
                  }
                  bVar1 = std::operator==(name,"--version");
                  if (bVar1) {
                    uVar4 = std::__cxx11::string::empty();
                    if ((uVar4 & 1) == 0) {
                      poVar9 = std::operator<<((ostream *)&std::cout,(string *)&this->version_info_)
                      ;
                      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                    }
                    poVar9 = std::operator<<((ostream *)&std::cout,"libprotoc ");
                    internal::VersionString_abi_cxx11_
                              ((string *)(plugin_name.field_2._M_local_buf + 8),(internal *)0x2dd278
                               ,version);
                    poVar9 = std::operator<<(poVar9,(string *)(plugin_name.field_2._M_local_buf + 8)
                                            );
                    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                    std::__cxx11::string::~string((string *)(plugin_name.field_2._M_local_buf + 8));
                    return PARSE_ARGUMENT_DONE_AND_EXIT;
                  }
                  bVar1 = std::operator==(name,"--disallow_services");
                  if (bVar1) {
                    this->disallow_services_ = true;
                  }
                  else {
                    bVar1 = std::operator==(name,"--encode");
                    if (((bVar1) || (bVar1 = std::operator==(name,"--decode"), bVar1)) ||
                       (bVar1 = std::operator==(name,"--decode_raw"), bVar1)) {
                      if (this->mode_ != MODE_COMPILE) {
                        poVar9 = std::operator<<((ostream *)&std::cerr,
                                                 "Only one of --encode and --decode can be specified."
                                                );
                        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                        return PARSE_ARGUMENT_FAIL;
                      }
                      bVar1 = std::
                              vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                              ::empty(&this->output_directives_);
                      if ((!bVar1) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
                        poVar9 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
                        poVar9 = std::operator<<(poVar9,(string *)name);
                        poVar9 = std::operator<<(poVar9,
                                                 " and generate code or descriptors at the same time."
                                                );
                        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                        return PARSE_ARGUMENT_FAIL;
                      }
                      bVar1 = std::operator==(name,"--encode");
                      MVar10 = MODE_DECODE;
                      if (bVar1) {
                        MVar10 = MODE_ENCODE;
                      }
                      this->mode_ = MVar10;
                      uVar4 = std::__cxx11::string::empty();
                      if (((uVar4 & 1) != 0) &&
                         (bVar1 = std::operator!=(name,"--decode_raw"), bVar1)) {
                        poVar9 = std::operator<<((ostream *)&std::cerr,"Type name for ");
                        poVar9 = std::operator<<(poVar9,(string *)name);
                        poVar9 = std::operator<<(poVar9," cannot be blank.");
                        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                        bVar1 = std::operator==(name,"--decode");
                        if (bVar1) {
                          poVar9 = std::operator<<((ostream *)&std::cerr,
                                                   "To decode an unknown message, use --decode_raw."
                                                  );
                          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                        }
                        return PARSE_ARGUMENT_FAIL;
                      }
                      uVar4 = std::__cxx11::string::empty();
                      if (((uVar4 & 1) == 0) &&
                         (bVar1 = std::operator==(name,"--decode_raw"), bVar1)) {
                        poVar9 = std::operator<<((ostream *)&std::cerr,
                                                 "--decode_raw does not take a parameter.");
                        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                        return PARSE_ARGUMENT_FAIL;
                      }
                      std::__cxx11::string::operator=
                                ((string *)&this->codec_type_,
                                 (string *)
                                 parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    }
                    else {
                      bVar1 = std::operator==(name,"--error_format");
                      if (bVar1) {
                        bVar1 = std::operator==(parts.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                                "gcc");
                        if (bVar1) {
                          this->error_format_ = ERROR_FORMAT_GCC;
                        }
                        else {
                          bVar1 = std::operator==(parts.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,"msvs");
                          if (!bVar1) {
                            poVar9 = std::operator<<((ostream *)&std::cerr,"Unknown error format: ")
                            ;
                            poVar9 = std::operator<<(poVar9,(string *)
                                                            parts.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                            return PARSE_ARGUMENT_FAIL;
                          }
                          this->error_format_ = ERROR_FORMAT_MSVS;
                        }
                      }
                      else {
                        bVar1 = std::operator==(name,"--plugin");
                        if (bVar1) {
                          uVar4 = std::__cxx11::string::empty();
                          if ((uVar4 & 1) != 0) {
                            poVar9 = std::operator<<((ostream *)&std::cerr,
                                                     "This compiler does not support plugins.");
                            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                            return PARSE_ARGUMENT_FAIL;
                          }
                          std::__cxx11::string::string((string *)(path.field_2._M_local_buf + 8));
                          std::__cxx11::string::string((string *)&equals_pos_1);
                          slash_pos = std::__cxx11::string::find_first_of
                                                ((char)parts.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 ,0x3d);
                          if (slash_pos == 0xffffffffffffffff) {
                            local_200 = std::__cxx11::string::find_last_of
                                                  ((char)parts.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,0x2f);
                            if (local_200 == -1) {
                              std::__cxx11::string::operator=
                                        ((string *)(path.field_2._M_local_buf + 8),
                                         (string *)
                                         parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            }
                            else {
                              std::__cxx11::string::substr
                                        ((ulong)local_220,
                                         (ulong)parts.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              std::__cxx11::string::operator=
                                        ((string *)(path.field_2._M_local_buf + 8),local_220);
                              std::__cxx11::string::~string(local_220);
                            }
                            std::__cxx11::string::operator=
                                      ((string *)&equals_pos_1,
                                       (string *)
                                       parts.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          }
                          else {
                            std::__cxx11::string::substr
                                      ((ulong)local_240,
                                       (ulong)parts.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::__cxx11::string::operator=
                                      ((string *)(path.field_2._M_local_buf + 8),local_240);
                            std::__cxx11::string::~string(local_240);
                            std::__cxx11::string::substr
                                      ((ulong)&generator_info,
                                       (ulong)parts.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::__cxx11::string::operator=
                                      ((string *)&equals_pos_1,(string *)&generator_info);
                            std::__cxx11::string::~string((string *)&generator_info);
                          }
                          pmVar8 = std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator[](&this->plugins_,
                                                (key_type *)((long)&path.field_2 + 8));
                          std::__cxx11::string::operator=((string *)pmVar8,(string *)&equals_pos_1);
                          std::__cxx11::string::~string((string *)&equals_pos_1);
                          std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
                        }
                        else {
                          bVar1 = std::operator==(name,"--print_free_field_numbers");
                          if (bVar1) {
                            if (this->mode_ != MODE_COMPILE) {
                              poVar9 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
                              poVar9 = std::operator<<(poVar9,(string *)name);
                              poVar9 = std::operator<<(poVar9,
                                                  " and use --encode, --decode or print ");
                              poVar9 = std::operator<<(poVar9,"other info at the same time.");
                              std::ostream::operator<<
                                        (poVar9,std::endl<char,std::char_traits<char>>);
                              return PARSE_ARGUMENT_FAIL;
                            }
                            bVar1 = std::
                                    vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                    ::empty(&this->output_directives_);
                            if ((!bVar1) ||
                               (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
                              poVar9 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
                              poVar9 = std::operator<<(poVar9,(string *)name);
                              poVar9 = std::operator<<(poVar9,
                                                  " and generate code or descriptors at the same time."
                                                  );
                              std::ostream::operator<<
                                        (poVar9,std::endl<char,std::char_traits<char>>);
                              return PARSE_ARGUMENT_FAIL;
                            }
                            this->mode_ = MODE_PRINT;
                            this->print_mode_ = PRINT_FREE_FIELDS;
                          }
                          else {
                            bVar1 = std::operator==(name,"--profile_path");
                            if (!bVar1) {
                              local_268 = FindOrNull<std::map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>>
                                                    (&this->generators_by_flag_name_,name);
                              parameters._6_1_ = 0;
                              parameters._5_1_ = 0;
                              local_439 = 0;
                              if (local_268 == (second_type *)0x0) {
                                bVar2 = std::__cxx11::string::empty();
                                local_43a = 1;
                                if ((bVar2 & 1) == 0) {
                                  std::allocator<char>::allocator();
                                  parameters._6_1_ = 1;
                                  std::__cxx11::string::string
                                            ((string *)&local_288,"_out",
                                             (allocator *)((long)&parameters + 7));
                                  parameters._5_1_ = 1;
                                  bVar1 = HasSuffixString(name,&local_288);
                                  local_43a = bVar1 ^ 0xff;
                                }
                                local_439 = local_43a;
                              }
                              if ((parameters._5_1_ & 1) != 0) {
                                std::__cxx11::string::~string((string *)&local_288);
                              }
                              if ((parameters._6_1_ & 1) != 0) {
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)((long)&parameters + 7));
                              }
                              if ((local_439 & 1) == 0) {
                                if (this->mode_ != MODE_COMPILE) {
                                  poVar9 = std::operator<<((ostream *)&std::cerr,
                                                                                                                      
                                                  "Cannot use --encode, --decode or print .proto info and generate code at the same time."
                                                  );
                                  std::ostream::operator<<
                                            (poVar9,std::endl<char,std::char_traits<char>>);
                                  return PARSE_ARGUMENT_FAIL;
                                }
                                OutputDirective::OutputDirective((OutputDirective *)&colon_pos);
                                std::__cxx11::string::operator=((string *)&colon_pos,(string *)name)
                                ;
                                if (local_268 == (second_type *)0x0) {
                                  directive.name.field_2._8_8_ = 0;
                                }
                                else {
                                  directive.name.field_2._8_8_ = local_268->generator;
                                }
                                local_380 = std::__cxx11::string::find_first_of
                                                      ((char)parts.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,0x3a);
                                if ((local_380 == -1) ||
                                   (bVar1 = anon_unknown_0::IsWindowsAbsolutePath
                                                      (parts.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ), bVar1)) {
                                  std::__cxx11::string::operator=
                                            ((string *)
                                             (directive.parameter.field_2._M_local_buf + 8),
                                             (string *)
                                             parts.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                                }
                                else {
                                  std::__cxx11::string::substr
                                            ((ulong)local_3a0,
                                             (ulong)parts.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            );
                                  std::__cxx11::string::operator=
                                            ((string *)&directive.generator,local_3a0);
                                  std::__cxx11::string::~string(local_3a0);
                                  std::__cxx11::string::substr
                                            ((ulong)local_3c0,
                                             (ulong)parts.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            );
                                  std::__cxx11::string::operator=
                                            ((string *)
                                             (directive.parameter.field_2._M_local_buf + 8),
                                             local_3c0);
                                  std::__cxx11::string::~string(local_3c0);
                                }
                                std::
                                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                ::push_back(&this->output_directives_,(value_type *)&colon_pos);
                                OutputDirective::~OutputDirective((OutputDirective *)&colon_pos);
                              }
                              else {
                                local_268 = FindOrNull<std::map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>>
                                                      (&this->generators_by_option_name_,name);
                                if (local_268 == (second_type *)0x0) {
                                  std::allocator<char>::allocator();
                                  parameters_1._6_1_ = 0;
                                  parameters_1._5_1_ = 0;
                                  std::__cxx11::string::string((string *)&local_2b8,"--",&local_2b9)
                                  ;
                                  bVar1 = HasPrefixString(name,&local_2b8);
                                  local_46a = false;
                                  if (bVar1) {
                                    std::allocator<char>::allocator();
                                    parameters_1._6_1_ = 1;
                                    std::__cxx11::string::string
                                              ((string *)&local_2e0,"_opt",
                                               (allocator *)((long)&parameters_1 + 7));
                                    parameters_1._5_1_ = 1;
                                    local_46a = HasSuffixString(name,&local_2e0);
                                  }
                                  if ((parameters_1._5_1_ & 1) != 0) {
                                    std::__cxx11::string::~string((string *)&local_2e0);
                                  }
                                  if ((parameters_1._6_1_ & 1) != 0) {
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)((long)&parameters_1 + 7));
                                  }
                                  std::__cxx11::string::~string((string *)&local_2b8);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
                                  if (local_46a == false) {
                                    poVar9 = std::operator<<((ostream *)&std::cerr,"Unknown flag: ")
                                    ;
                                    poVar9 = std::operator<<(poVar9,(string *)name);
                                    std::ostream::operator<<
                                              (poVar9,std::endl<char,std::char_traits<char>>);
                                    return PARSE_ARGUMENT_FAIL;
                                  }
                                  __return_storage_ptr__ =
                                       (string *)((long)&directive.output_location.field_2 + 8);
                                  anon_unknown_0::PluginName
                                            (__return_storage_ptr__,&this->plugin_prefix_,name);
                                  pmVar8 = std::
                                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ::operator[](&this->plugin_parameters_,
                                                        __return_storage_ptr__);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             (directive.output_location.field_2._M_local_buf + 8));
                                  uVar4 = std::__cxx11::string::empty();
                                  if ((uVar4 & 1) == 0) {
                                    std::__cxx11::string::append((char *)pmVar8);
                                  }
                                  std::__cxx11::string::append((string *)pmVar8);
                                }
                                else {
                                  local_298 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::operator[](&this->generator_parameters_,
                                                           &local_268->flag_name);
                                  uVar4 = std::__cxx11::string::empty();
                                  if ((uVar4 & 1) == 0) {
                                    std::__cxx11::string::append((char *)local_298);
                                  }
                                  std::__cxx11::string::append((string *)local_298);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "You seem to have passed an empty string as one of the arguments to "
                              );
      poVar9 = std::operator<<(poVar9,(string *)this);
      poVar9 = std::operator<<(poVar9,
                               ".  This is actually sort of hard to do.  Congrats.  Unfortunately it is not valid input so the program is going to die now."
                              );
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->input_files_,
                parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::InterpretArgument(const string& name,
                                        const string& value) {
  if (name.empty()) {
    // Not a flag.  Just a filename.
    if (value.empty()) {
      std::cerr
          << "You seem to have passed an empty string as one of the "
             "arguments to " << executable_name_
          << ".  This is actually "
             "sort of hard to do.  Congrats.  Unfortunately it is not valid "
             "input so the program is going to die now." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    input_files_.push_back(value);

  } else if (name == "-I" || name == "--proto_path") {
    // Java's -classpath (and some other languages) delimits path components
    // with colons.  Let's accept that syntax too just to make things more
    // intuitive.
    std::vector<string> parts = Split(
        value, kPathSeparator, true);

    for (int i = 0; i < parts.size(); i++) {
      string virtual_path;
      string disk_path;

      string::size_type equals_pos = parts[i].find_first_of('=');
      if (equals_pos == string::npos) {
        virtual_path = "";
        disk_path = parts[i];
      } else {
        virtual_path = parts[i].substr(0, equals_pos);
        disk_path = parts[i].substr(equals_pos + 1);
      }

      if (disk_path.empty()) {
        std::cerr
            << "--proto_path passed empty directory name.  (Use \".\" for "
               "current directory.)" << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      // Make sure disk path exists, warn otherwise.
      if (access(disk_path.c_str(), F_OK) < 0) {
        // Try the original path; it may have just happed to have a '=' in it.
        if (access(parts[i].c_str(), F_OK) < 0) {
          std::cerr << disk_path << ": warning: directory does not exist."
                    << std::endl;
        } else {
          virtual_path = "";
          disk_path = parts[i];
        }
      }

      // Don't use make_pair as the old/default standard library on Solaris
      // doesn't support it without explicit template parameters, which are
      // incompatible with C++0x's make_pair.
      proto_path_.push_back(std::pair<string, string>(virtual_path, disk_path));
    }

  } else if (name == "--direct_dependencies") {
    if (direct_dependencies_explicitly_set_) {
      std::cerr << name << " may only be passed once. To specify multiple "
                           "direct dependencies, pass them all as a single "
                           "parameter separated by ':'."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    direct_dependencies_explicitly_set_ = true;
    std::vector<string> direct = Split(
        value, ":", true);
    GOOGLE_DCHECK(direct_dependencies_.empty());
    direct_dependencies_.insert(direct.begin(), direct.end());

  } else if (name == "--direct_dependencies_violation_msg") {
    direct_dependencies_violation_msg_ = value;

  } else if (name == "-o" || name == "--descriptor_set_out") {
    if (!descriptor_set_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate descriptors at the "
             "same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    descriptor_set_name_ = value;

  } else if (name == "--dependency_out") {
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    dependency_out_name_ = value;

  } else if (name == "--include_imports") {
    if (imports_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    imports_in_descriptor_set_ = true;

  } else if (name == "--include_source_info") {
    if (source_info_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    source_info_in_descriptor_set_ = true;

  } else if (name == "-h" || name == "--help") {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--version") {
    if (!version_info_.empty()) {
      std::cout << version_info_ << std::endl;
    }
    cout << "libprotoc "
         << protobuf::internal::VersionString(GOOGLE_PROTOBUF_VERSION)
         << endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--disallow_services") {
    disallow_services_ = true;

  } else if (name == "--encode" || name == "--decode" ||
             name == "--decode_raw") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Only one of --encode and --decode can be specified."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    mode_ = (name == "--encode") ? MODE_ENCODE : MODE_DECODE;

    if (value.empty() && name != "--decode_raw") {
      std::cerr << "Type name for " << name << " cannot be blank." << std::endl;
      if (name == "--decode") {
        std::cerr << "To decode an unknown message, use --decode_raw."
                  << std::endl;
      }
      return PARSE_ARGUMENT_FAIL;
    } else if (!value.empty() && name == "--decode_raw") {
      std::cerr << "--decode_raw does not take a parameter." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    codec_type_ = value;

  } else if (name == "--error_format") {
    if (value == "gcc") {
      error_format_ = ERROR_FORMAT_GCC;
    } else if (value == "msvs") {
      error_format_ = ERROR_FORMAT_MSVS;
    } else {
      std::cerr << "Unknown error format: " << value << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

  } else if (name == "--plugin") {
    if (plugin_prefix_.empty()) {
      std::cerr << "This compiler does not support plugins." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    string plugin_name;
    string path;

    string::size_type equals_pos = value.find_first_of('=');
    if (equals_pos == string::npos) {
      // Use the basename of the file.
      string::size_type slash_pos = value.find_last_of('/');
      if (slash_pos == string::npos) {
        plugin_name = value;
      } else {
        plugin_name = value.substr(slash_pos + 1);
      }
      path = value;
    } else {
      plugin_name = value.substr(0, equals_pos);
      path = value.substr(equals_pos + 1);
    }

    plugins_[plugin_name] = path;

  } else if (name == "--print_free_field_numbers") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Cannot use " << name
                << " and use --encode, --decode or print "
                << "other info at the same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    mode_ = MODE_PRINT;
    print_mode_ = PRINT_FREE_FIELDS;
  } else if (name == "--profile_path") {
  } else {
    // Some other flag.  Look it up in the generators list.
    const GeneratorInfo* generator_info =
        FindOrNull(generators_by_flag_name_, name);
    if (generator_info == NULL &&
        (plugin_prefix_.empty() || !HasSuffixString(name, "_out"))) {
      // Check if it's a generator option flag.
      generator_info = FindOrNull(generators_by_option_name_, name);
      if (generator_info != NULL) {
        string* parameters = &generator_parameters_[generator_info->flag_name];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else if (HasPrefixString(name, "--") && HasSuffixString(name, "_opt")) {
        string* parameters =
            &plugin_parameters_[PluginName(plugin_prefix_, name)];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else {
        std::cerr << "Unknown flag: " << name << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
    } else {
      // It's an output flag.  Add it to the output directives.
      if (mode_ != MODE_COMPILE) {
        std::cerr << "Cannot use --encode, --decode or print .proto info and "
                     "generate code at the same time." << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      OutputDirective directive;
      directive.name = name;
      if (generator_info == NULL) {
        directive.generator = NULL;
      } else {
        directive.generator = generator_info->generator;
      }

      // Split value at ':' to separate the generator parameter from the
      // filename.  However, avoid doing this if the colon is part of a valid
      // Windows-style absolute path.
      string::size_type colon_pos = value.find_first_of(':');
      if (colon_pos == string::npos || IsWindowsAbsolutePath(value)) {
        directive.output_location = value;
      } else {
        directive.parameter = value.substr(0, colon_pos);
        directive.output_location = value.substr(colon_pos + 1);
      }

      output_directives_.push_back(directive);
    }
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}